

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_server.cpp
# Opt level: O0

int __thiscall CNetServer::Recv(CNetServer *this,CNetChunk *pChunk,TOKEN *pResponseToken)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  CNetBan *pCVar4;
  NETADDR *pNVar5;
  CNetTokenCache *in_RDX;
  CNetBan *in_RSI;
  CNetServer *in_RDI;
  long in_FS_OFFSET;
  int i_2;
  int i_1;
  bool Continue;
  int FoundAddr;
  int Accept;
  int i;
  bool Found;
  int Time;
  int Result;
  int LastInfoQuery;
  char aBuf_1 [128];
  char FullMsg [20];
  char aBuf [128];
  NETADDR Addr;
  int in_stack_00000400;
  TOKEN in_stack_fffffffffffffe3c;
  CNetConnection *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  TOKEN in_stack_fffffffffffffe4c;
  CNetPacketConstruct *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe58;
  TOKEN in_stack_fffffffffffffe5c;
  CNetConnection *in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe74;
  int in_stack_fffffffffffffe78;
  uint in_stack_fffffffffffffe7c;
  int in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  int iVar6;
  uint in_stack_fffffffffffffe8c;
  int in_stack_fffffffffffffe90;
  int local_150;
  int local_14c;
  undefined1 local_148 [48];
  NETADDR local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
LAB_00248d05:
  do {
    do {
      bVar1 = CNetRecvUnpacker::IsActive(&in_RDI->m_RecvUnpacker);
      if ((bVar1) &&
         (iVar2 = CNetRecvUnpacker::FetchChunk
                            ((CNetRecvUnpacker *)in_RDI,(CNetChunk *)in_stack_fffffffffffffe60),
         iVar2 != 0)) {
        local_150 = 1;
        goto LAB_0024941b;
      }
      iVar2 = CNetBase::UnpackPacket
                        (&in_RDI->super_CNetBase,(NETADDR *)in_stack_fffffffffffffe60,
                         (uchar *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                         in_stack_fffffffffffffe50);
      if (0 < iVar2) {
        local_150 = 0;
        goto LAB_0024941b;
      }
    } while (iVar2 != 0);
    pCVar4 = NetBan(in_RDI);
    if (pCVar4 != (CNetBan *)0x0) {
      NetBan(in_RDI);
      bVar1 = CNetBan::IsBanned(in_RSI,(NETADDR_conflict *)in_RDX,
                                (char *)CONCAT44(iVar2,in_stack_fffffffffffffe90),
                                in_stack_fffffffffffffe8c,
                                (int *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80)
                               );
      if (bVar1) {
        in_stack_fffffffffffffe90 = time_timestamp();
        if (local_14c + 5 < in_stack_fffffffffffffe90) {
          in_stack_fffffffffffffe5c = (in_RDI->m_RecvUnpacker).m_Data.m_ResponseToken;
          in_stack_fffffffffffffe60 = (CNetConnection *)&stack0xffffffffffffff58;
          str_length((char *)0x248e15);
          CNetBase::SendControlMsg
                    ((CNetBase *)in_stack_fffffffffffffe60,
                     (NETADDR *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                     (TOKEN)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                     (int)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
                     in_stack_fffffffffffffe40,in_stack_00000400);
        }
        goto LAB_00248d05;
      }
    }
    in_stack_fffffffffffffe8c = in_stack_fffffffffffffe8c & 0xffffff;
    for (iVar6 = 0; iVar6 < 0x40; iVar6 = iVar6 + 1) {
      iVar3 = CNetConnection::State(&in_RDI->m_aSlots[iVar6].m_Connection);
      if (iVar3 != 0) {
        CNetConnection::PeerAddress(&in_RDI->m_aSlots[iVar6].m_Connection);
        iVar3 = net_addr_comp((NETADDR *)
                              CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                              (NETADDR *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c);
        if (iVar3 == 0) {
          iVar3 = CNetConnection::Feed
                            (in_stack_fffffffffffffe60,
                             (CNetPacketConstruct *)
                             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                             (NETADDR *)in_stack_fffffffffffffe50);
          if ((iVar3 != 0) && ((in_RDI->m_RecvUnpacker).m_Data.m_DataSize != 0)) {
            if (((in_RDI->m_RecvUnpacker).m_Data.m_Flags & 8U) != 0) {
              *(undefined4 *)((long)(in_RSI->m_BanAddrPool).m_paaHashList[0] + 4) = 2;
              pNVar5 = CNetConnection::PeerAddress(&in_RDI->m_aSlots[iVar6].m_Connection);
              *(undefined8 *)((long)&in_RSI->_vptr_CNetBan + 4) = *(undefined8 *)pNVar5;
              *(undefined8 *)((long)&in_RSI->m_pConsole + 4) = *(undefined8 *)(pNVar5->ip + 4);
              *(undefined8 *)((long)&in_RSI->m_pStorage + 4) = *(undefined8 *)(pNVar5->ip + 0xc);
              *(int *)&in_RSI->_vptr_CNetBan = iVar6;
              *(int *)((in_RSI->m_BanAddrPool).m_paaHashList[0] + 1) =
                   (in_RDI->m_RecvUnpacker).m_Data.m_DataSize;
              (in_RSI->m_BanAddrPool).m_paaHashList[0][2] =
                   (CBan<NETADDR> *)(in_RDI->m_RecvUnpacker).m_Data.m_aChunkData;
              if (in_RDX != (CNetTokenCache *)0x0) {
                *(uint *)&(in_RDX->m_TokenCache).super_CRingBufferBase.m_pProduce = 0xffffffff;
              }
              local_150 = 1;
              goto LAB_0024941b;
            }
            CNetRecvUnpacker::Start
                      (&in_RDI->m_RecvUnpacker,&local_20,&in_RDI->m_aSlots[iVar6].m_Connection,iVar6
                      );
          }
          in_stack_fffffffffffffe8c = CONCAT13(1,(int3)in_stack_fffffffffffffe8c);
        }
      }
    }
    if (((in_stack_fffffffffffffe8c & 0x1000000) == 0) &&
       (in_stack_fffffffffffffe84 =
             CNetTokenManager::ProcessMessage
                       ((CNetTokenManager *)
                        CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                        (NETADDR *)CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78),
                        (CNetPacketConstruct *)
                        CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70)),
       0 < in_stack_fffffffffffffe84)) {
      if (((in_RDI->m_RecvUnpacker).m_Data.m_Flags & 1U) == 0) {
        if (((in_RDI->m_RecvUnpacker).m_Data.m_Flags & 8U) != 0) {
          *(undefined4 *)((long)(in_RSI->m_BanAddrPool).m_paaHashList[0] + 4) = 2;
          *(undefined4 *)&in_RSI->_vptr_CNetBan = 0xffffffff;
          *(undefined8 *)((long)&in_RSI->_vptr_CNetBan + 4) = local_20._0_8_;
          *(undefined8 *)((long)&in_RSI->m_pConsole + 4) = local_20.ip._4_8_;
          *(undefined8 *)((long)&in_RSI->m_pStorage + 4) = local_20._16_8_;
          *(int *)((in_RSI->m_BanAddrPool).m_paaHashList[0] + 1) =
               (in_RDI->m_RecvUnpacker).m_Data.m_DataSize;
          (in_RSI->m_BanAddrPool).m_paaHashList[0][2] =
               (CBan<NETADDR> *)(in_RDI->m_RecvUnpacker).m_Data.m_aChunkData;
          if (in_RDX != (CNetTokenCache *)0x0) {
            *(TOKEN *)&(in_RDX->m_TokenCache).super_CRingBufferBase.m_pProduce =
                 (in_RDI->m_RecvUnpacker).m_Data.m_ResponseToken;
          }
          local_150 = 1;
LAB_0024941b:
          if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
            __stack_chk_fail();
          }
          return local_150;
        }
      }
      else if ((in_RDI->m_RecvUnpacker).m_Data.m_aChunkData[0] == '\x01') {
        if (in_RDI->m_NumClients < in_RDI->m_MaxClients) {
          iVar2 = 1;
          in_stack_fffffffffffffe7c = in_stack_fffffffffffffe7c & 0xffffff;
          for (in_stack_fffffffffffffe78 = 0; in_stack_fffffffffffffe80 = iVar2,
              in_stack_fffffffffffffe78 < 0x40;
              in_stack_fffffffffffffe78 = in_stack_fffffffffffffe78 + 1) {
            iVar6 = CNetConnection::State(&in_RDI->m_aSlots[in_stack_fffffffffffffe78].m_Connection)
            ;
            if (iVar6 != 0) {
              CNetConnection::PeerAddress(&in_RDI->m_aSlots[in_stack_fffffffffffffe78].m_Connection)
              ;
              iVar6 = net_addr_comp((NETADDR *)
                                    CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                                    (NETADDR *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c);
              if ((iVar6 == 0) &&
                 (in_stack_fffffffffffffe80 = iVar2 + 1, bVar1 = in_RDI->m_MaxClientsPerIP <= iVar2,
                 iVar2 = in_stack_fffffffffffffe80, bVar1)) {
                str_format(local_148,0x80,"Only %d players with the same IP are allowed",
                           (ulong)(uint)in_RDI->m_MaxClientsPerIP);
                in_stack_fffffffffffffe4c = (in_RDI->m_RecvUnpacker).m_Data.m_ResponseToken;
                in_stack_fffffffffffffe50 = (CNetPacketConstruct *)local_148;
                str_length((char *)0x2491ed);
                CNetBase::SendControlMsg
                          ((CNetBase *)in_stack_fffffffffffffe60,
                           (NETADDR *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                           (TOKEN)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                           (int)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
                           in_stack_fffffffffffffe40,in_stack_00000400);
                in_stack_fffffffffffffe7c = CONCAT13(1,(int3)in_stack_fffffffffffffe7c);
                break;
              }
            }
          }
          if ((in_stack_fffffffffffffe7c & 0x1000000) == 0) {
            for (in_stack_fffffffffffffe74 = 0; in_stack_fffffffffffffe74 < 0x40;
                in_stack_fffffffffffffe74 = in_stack_fffffffffffffe74 + 1) {
              iVar2 = CNetConnection::State
                                (&in_RDI->m_aSlots[in_stack_fffffffffffffe74].m_Connection);
              if (iVar2 == 0) {
                in_RDI->m_NumClients = in_RDI->m_NumClients + 1;
                CNetConnection::SetToken(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c);
                CNetConnection::Feed
                          (in_stack_fffffffffffffe60,
                           (CNetPacketConstruct *)
                           CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                           (NETADDR *)in_stack_fffffffffffffe50);
                if (in_RDI->m_pfnNewClient != (NETFUNC_NEWCLIENT)0x0) {
                  (*in_RDI->m_pfnNewClient)(in_stack_fffffffffffffe74,in_RDI->m_UserPtr);
                }
                break;
              }
            }
          }
        }
        else {
          CNetBase::SendControlMsg
                    ((CNetBase *)in_stack_fffffffffffffe60,
                     (NETADDR *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                     (TOKEN)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                     (int)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
                     in_stack_fffffffffffffe40,in_stack_00000400);
        }
      }
      else if ((in_RDI->m_RecvUnpacker).m_Data.m_aChunkData[0] == '\x05') {
        CNetTokenCache::AddToken
                  (in_RDX,(NETADDR *)CONCAT44(iVar2,in_stack_fffffffffffffe90),
                   in_stack_fffffffffffffe8c,iVar6);
      }
    }
  } while( true );
}

Assistant:

int CNetServer::Recv(CNetChunk *pChunk, TOKEN *pResponseToken)
{
	while(1)
	{
		// check for a chunk
		if(m_RecvUnpacker.IsActive() && m_RecvUnpacker.FetchChunk(pChunk))
			return 1;

		// TODO: empty the recvinfo
		NETADDR Addr;
		int Result = UnpackPacket(&Addr, m_RecvUnpacker.m_aBuffer, &m_RecvUnpacker.m_Data);
		// no more packets for now
		if(Result > 0)
			break;

		if(!Result)
		{
			// check for bans
			char aBuf[128];
			int LastInfoQuery;
			if(NetBan() && NetBan()->IsBanned(&Addr, aBuf, sizeof(aBuf), &LastInfoQuery))
			{
				// banned, reply with a message (5 second cooldown)
				int Time = time_timestamp();
				if(LastInfoQuery + 5 < Time)
				{
					SendControlMsg(&Addr, m_RecvUnpacker.m_Data.m_ResponseToken, 0, NET_CTRLMSG_CLOSE, aBuf, str_length(aBuf) + 1);
				}
				continue;
			}

			bool Found = false;
			// try to find matching slot
			for(int i = 0; i < NET_MAX_CLIENTS; i++)
			{
				if(m_aSlots[i].m_Connection.State() == NET_CONNSTATE_OFFLINE)
					continue;

				if(net_addr_comp(m_aSlots[i].m_Connection.PeerAddress(), &Addr, true) == 0)
				{
					if(m_aSlots[i].m_Connection.Feed(&m_RecvUnpacker.m_Data, &Addr))
					{
						if(m_RecvUnpacker.m_Data.m_DataSize)
						{
							if(!(m_RecvUnpacker.m_Data.m_Flags&NET_PACKETFLAG_CONNLESS))
								m_RecvUnpacker.Start(&Addr, &m_aSlots[i].m_Connection, i);
							else
							{
								pChunk->m_Flags = NETSENDFLAG_CONNLESS;
								pChunk->m_Address = *m_aSlots[i].m_Connection.PeerAddress();
								pChunk->m_ClientID = i;
								pChunk->m_DataSize = m_RecvUnpacker.m_Data.m_DataSize;
								pChunk->m_pData = m_RecvUnpacker.m_Data.m_aChunkData;
								if(pResponseToken)
									*pResponseToken = NET_TOKEN_NONE;
								return 1;
							}
						}
					}
					Found = true;
				}
			}

			if(Found)
				continue;

			int Accept = m_TokenManager.ProcessMessage(&Addr, &m_RecvUnpacker.m_Data);
			if(Accept <= 0)
				continue;

			if(m_RecvUnpacker.m_Data.m_Flags&NET_PACKETFLAG_CONTROL)
			{
				if(m_RecvUnpacker.m_Data.m_aChunkData[0] == NET_CTRLMSG_CONNECT)
				{
					// check if there are free slots
					if(m_NumClients >= m_MaxClients)
					{
						const char FullMsg[] = "This server is full";
						SendControlMsg(&Addr, m_RecvUnpacker.m_Data.m_ResponseToken, 0, NET_CTRLMSG_CLOSE, FullMsg, sizeof(FullMsg));
						continue;
					}

					// only allow a specific number of players with the same ip
					int FoundAddr = 1;
					
					bool Continue = false;
					for(int i = 0; i < NET_MAX_CLIENTS; i++)
					{
						if(m_aSlots[i].m_Connection.State() == NET_CONNSTATE_OFFLINE)
							continue;

						if(!net_addr_comp(&Addr, m_aSlots[i].m_Connection.PeerAddress(), false))
						{
							if(FoundAddr++ >= m_MaxClientsPerIP)
							{
								char aBuf[128];
								str_format(aBuf, sizeof(aBuf), "Only %d players with the same IP are allowed", m_MaxClientsPerIP);
								SendControlMsg(&Addr, m_RecvUnpacker.m_Data.m_ResponseToken, 0, NET_CTRLMSG_CLOSE, aBuf, str_length(aBuf) + 1);
								Continue = true;
								break;
							}
						}
					}

					if(Continue)
						continue;

					for(int i = 0; i < NET_MAX_CLIENTS; i++)
					{
						if(m_aSlots[i].m_Connection.State() == NET_CONNSTATE_OFFLINE)
						{
							m_NumClients++;
							m_aSlots[i].m_Connection.SetToken(m_RecvUnpacker.m_Data.m_Token);
							m_aSlots[i].m_Connection.Feed(&m_RecvUnpacker.m_Data, &Addr);
							if(m_pfnNewClient)
								m_pfnNewClient(i, m_UserPtr);
							break;
						}
					}
				}
				else if(m_RecvUnpacker.m_Data.m_aChunkData[0] == NET_CTRLMSG_TOKEN)
					m_TokenCache.AddToken(&Addr, m_RecvUnpacker.m_Data.m_ResponseToken, NET_TOKENFLAG_RESPONSEONLY);
			}
			else if(m_RecvUnpacker.m_Data.m_Flags&NET_PACKETFLAG_CONNLESS)
			{
				pChunk->m_Flags = NETSENDFLAG_CONNLESS;
				pChunk->m_ClientID = -1;
				pChunk->m_Address = Addr;
				pChunk->m_DataSize = m_RecvUnpacker.m_Data.m_DataSize;
				pChunk->m_pData = m_RecvUnpacker.m_Data.m_aChunkData;
				if(pResponseToken)
					*pResponseToken = m_RecvUnpacker.m_Data.m_ResponseToken;
				return 1;
			}
		}
	}
	return 0;
}